

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

char * mode_str(MIR_op_mode_t mode)

{
  char *pcStack_10;
  MIR_op_mode_t mode_local;
  
  switch(mode) {
  case MIR_OP_UNDEF:
    pcStack_10 = "undef";
    break;
  case MIR_OP_REG:
    pcStack_10 = "reg";
    break;
  case MIR_OP_VAR:
    pcStack_10 = "var";
    break;
  case MIR_OP_INT:
    pcStack_10 = "int";
    break;
  case MIR_OP_UINT:
    pcStack_10 = "uint";
    break;
  case MIR_OP_FLOAT:
    pcStack_10 = "float";
    break;
  case MIR_OP_DOUBLE:
    pcStack_10 = "double";
    break;
  case MIR_OP_LDOUBLE:
    pcStack_10 = "ldouble";
    break;
  case MIR_OP_REF:
    pcStack_10 = "ref";
    break;
  case MIR_OP_STR:
    pcStack_10 = "str";
    break;
  case MIR_OP_MEM:
    pcStack_10 = "mem";
    break;
  case MIR_OP_VAR_MEM:
    pcStack_10 = "var_mem";
    break;
  case MIR_OP_LABEL:
    pcStack_10 = "label";
    break;
  case MIR_OP_BOUND:
    pcStack_10 = "bound";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char *mode_str (MIR_op_mode_t mode) {
  switch (mode) {
  case MIR_OP_REG: return "reg";
  case MIR_OP_VAR: return "var";
  case MIR_OP_INT: return "int";
  case MIR_OP_UINT: return "uint";
  case MIR_OP_FLOAT: return "float";
  case MIR_OP_DOUBLE: return "double";
  case MIR_OP_LDOUBLE: return "ldouble";
  case MIR_OP_REF: return "ref";
  case MIR_OP_STR: return "str";
  case MIR_OP_MEM: return "mem";
  case MIR_OP_VAR_MEM: return "var_mem";
  case MIR_OP_LABEL: return "label";
  case MIR_OP_BOUND: return "bound";
  case MIR_OP_UNDEF: return "undef";
  default: return "";
  }
}